

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  runtime_error *this;
  command_t *source_00;
  size_t sourceSize;
  program_t *value;
  stack_t *psVar2;
  program_t *prog;
  vm_t vm;
  value_t *tmp;
  source_t source;
  istream local_220 [8];
  ifstream input;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    argv_local._4_4_ = noargs();
  }
  else {
    std::ifstream::ifstream(local_220);
    std::ifstream::open((char *)local_220,(_Ios_Openmode)argv[1]);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Can\'t open file");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    deci::AssembleProgram((source_t *)&tmp,local_220);
    std::ifstream::close();
    deci::vm_t::vm_t((vm_t *)&prog);
    source_00 = std::vector<deci::command_t,_std::allocator<deci::command_t>_>::data
                          ((vector<deci::command_t,_std::allocator<deci::command_t>_> *)&tmp);
    sourceSize = deci::countof<deci::command_t,10ul>(&commands);
    value = deci::program_t::Create(source_00,sourceSize);
    psVar2 = deci::vm_t::GlobalStack((vm_t *)&prog);
    vm.dataStack.result = deci::vm_t::Run((vm_t *)&prog,(value_t *)value);
    deci::stack_t::Push(psVar2,vm.dataStack.result);
    psVar2 = deci::vm_t::GlobalStack((vm_t *)&prog);
    deci::stack_t::Print(psVar2,(ostream *)&std::cout);
    (*(vm.dataStack.result)->_vptr_value_t[3])();
    (*(value->super_function_t).super_value_t._vptr_value_t[3])();
    argv_local._4_4_ = 0;
    deci::vm_t::~vm_t((vm_t *)&prog);
    std::vector<deci::command_t,_std::allocator<deci::command_t>_>::~vector
              ((vector<deci::command_t,_std::allocator<deci::command_t>_> *)&tmp);
    std::ifstream::~ifstream(local_220);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc == 1) {
    return noargs();
  }

  std::ifstream input;
  input.open(argv[1], std::ios::in);
  if (!input.good()) {
    throw std::runtime_error("Can't open file");
  }

  deci::program_t::source_t source = deci::AssembleProgram(input);
  input.close();

  deci::value_t* tmp;
  deci::vm_t vm;
  deci::program_t* prog = deci::program_t::Create(source.data(), deci::countof(commands));

  vm.GlobalStack().Push(*(tmp = vm.Run(*prog)));
  vm.GlobalStack().Print(std::cout);

  tmp->Delete();
  prog->Delete();

  return 0;
}